

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlnode.cpp
# Opt level: O0

string * __thiscall
libcellml::XmlNode::convertToStrippedString_abi_cxx11_(string *__return_storage_ptr__,XmlNode *this)

{
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0;
  undefined8 local_a8 [2];
  undefined1 local_98 [8];
  undefined1 local_90 [8];
  reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_50;
  undefined8 local_48;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  undefined8 local_38;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  undefined8 local_28;
  undefined1 local_19;
  XmlNode *local_18;
  XmlNode *this_local;
  string *contentString;
  
  local_19 = 0;
  local_18 = this;
  this_local = (XmlNode *)__return_storage_ptr__;
  convertToString_abi_cxx11_(__return_storage_ptr__,this);
  local_30._M_current = (char *)std::__cxx11::string::begin();
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_28,&local_30);
  local_48 = std::__cxx11::string::begin();
  local_50 = std::__cxx11::string::end();
  local_40 = std::
             find_if_not<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,libcellml::XmlNode::convertToStrippedString()const::__0>
                       (local_48,local_50);
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_38,&local_40);
  local_70 = std::__cxx11::string::erase(__return_storage_ptr__,local_28,local_38);
  std::__cxx11::string::rbegin();
  std::__cxx11::string::rend();
  std::
  find_if_not<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,libcellml::XmlNode::convertToStrippedString()const::__1>
            (&local_88,local_90,local_98);
  local_80._M_current =
       (char *)std::
               reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::base(&local_88);
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_78,&local_80);
  local_b0._M_current = (char *)std::__cxx11::string::end();
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<char_const*,std::__cxx11::string> *)local_a8,&local_b0);
  std::__cxx11::string::erase(__return_storage_ptr__,local_78,local_a8[0]);
  return __return_storage_ptr__;
}

Assistant:

std::string XmlNode::convertToStrippedString() const
{
    std::string contentString = convertToString();
    contentString.erase(contentString.begin(), find_if_not(contentString.begin(), contentString.end(), [](int c) { return isspace(c); }));
    contentString.erase(find_if_not(contentString.rbegin(), contentString.rend(), [](int c) { return isspace(c); }).base(), contentString.end());
    return contentString;
}